

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O2

bool __thiscall
crnlib::lzma_codec::unpack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  packed_uint<4U> *this_00;
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t destLen;
  size_t srcLen;
  
  vector<unsigned_char>::resize(buf,0,false);
  if ((0x13 < n) && ((ushort)(*p << 8 | *p >> 8) == 0x304c)) {
    uVar3 = adler32((uchar *)((long)p + 3),0x11,1);
    if (*(char *)((long)p + 2) == (char)uVar3) {
      this_00 = (packed_uint<4U> *)((long)p + 0xc);
      uVar4 = packed_uint::operator_cast_to_unsigned_int(this_00);
      if (uVar4 == 0) {
        return true;
      }
      uVar4 = packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)((long)p + 8));
      if ((uVar4 != 0) &&
         (uVar4 = packed_uint::operator_cast_to_unsigned_int(this_00), uVar4 < 0x40000001)) {
        uVar4 = packed_uint::operator_cast_to_unsigned_int(this_00);
        bVar2 = vector<unsigned_char>::try_resize(buf,uVar4,false);
        if (!bVar2) {
          return false;
        }
        srcLen = (ulong)n - 0x14;
        uVar4 = packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)((long)p + 8));
        if ((ulong)uVar4 <= (ulong)n - 0x14) {
          uVar4 = packed_uint::operator_cast_to_unsigned_int(this_00);
          destLen = (size_t)uVar4;
          iVar5 = (*this->m_pUncompress)
                            (buf->m_p,&destLen,(uchar *)((long)p + 0x14),&srcLen,
                             (uchar *)((long)p + 3),5);
          sVar1 = destLen;
          if ((iVar5 == 0) &&
             (uVar4 = packed_uint::operator_cast_to_unsigned_int(this_00), sVar1 == uVar4)) {
            uVar3 = adler32(buf->m_p,(ulong)buf->m_size,1);
            uVar4 = packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)((long)p + 0x10));
            if (uVar3 == uVar4) {
              return true;
            }
          }
          vector<unsigned_char>::clear(buf);
        }
      }
    }
  }
  return false;
}

Assistant:

bool lzma_codec::unpack(const void* p, uint n, crnlib::vector<uint8>& buf)
    {
        buf.resize(0);

        if (n < sizeof(header))
        {
            return false;
        }

        const header& hdr = *static_cast<const header*>(p);
        if (hdr.m_sig != header::cSig)
        {
            return false;
        }

        if (static_cast<uint8>(adler32((const uint8*)&hdr + header::cChecksumSkipBytes, sizeof(hdr) - header::cChecksumSkipBytes)) != hdr.m_checksum)
        {
            return false;
        }

        if (!hdr.m_uncomp_size)
        {
            return true;
        }

        if (!hdr.m_comp_size)
        {
            return false;
        }

        if (hdr.m_uncomp_size > 1024U * 1024U * 1024U)
        {
            return false;
        }

        if (!buf.try_resize(hdr.m_uncomp_size))
        {
            return false;
        }

        const uint8* pComp_data = static_cast<const uint8*>(p) + sizeof(header);
        size_t srcLen = n - sizeof(header);
        if (srcLen < hdr.m_comp_size)
        {
            return false;
        }

        size_t destLen = hdr.m_uncomp_size;

        int status = (*m_pUncompress)(&buf[0], &destLen, pComp_data, &srcLen, hdr.m_lzma_props, cLZMAPropsSize);

        if ((status != SZ_OK) || (destLen != hdr.m_uncomp_size))
        {
            buf.clear();
            return false;
        }

        if (adler32(&buf[0], buf.size()) != hdr.m_adler32)
        {
            buf.clear();
            return false;
        }

        return true;
    }